

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertStrUtil.cpp
# Opt level: O0

string * lzstring::to_string(string *__return_storage_ptr__,wstring *src)

{
  wchar_t *pwVar1;
  size_type sVar2;
  reference __s;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_70;
  char *local_68;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_60;
  allocator_type local_41;
  undefined1 local_40 [8];
  vector<char,_std::allocator<char>_> tmp;
  size_t mbs_len;
  wstring *src_local;
  string *dest;
  
  setlocale(0,"");
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  pwVar1 = (wchar_t *)std::__cxx11::wstring::c_str();
  tmp.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
       wcstombs((char *)0x0,pwVar1,0);
  sVar2 = tmp.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ + 1;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_40,sVar2,&local_41);
  std::allocator<char>::~allocator(&local_41);
  __s = std::vector<char,_std::allocator<char>_>::operator[]
                  ((vector<char,_std::allocator<char>_> *)local_40,0);
  pwVar1 = (wchar_t *)std::__cxx11::wstring::c_str();
  sVar2 = std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)local_40);
  wcstombs(__s,pwVar1,sVar2);
  local_60._M_current =
       (char *)std::vector<char,_std::allocator<char>_>::begin
                         ((vector<char,_std::allocator<char>_> *)local_40);
  local_70._M_current =
       (char *)std::vector<char,_std::allocator<char>_>::end
                         ((vector<char,_std::allocator<char>_> *)local_40);
  local_68 = (char *)__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                     ::operator-(&local_70,1);
  std::__cxx11::string::
  assign<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
            ((string *)__return_storage_ptr__,local_60,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)local_68);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_40)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(std::wstring const &src)
{
    std::setlocale(LC_CTYPE, "");

    std::string dest;
    size_t const mbs_len = wcstombs(NULL, src.c_str(), 0);
    std::vector<char> tmp(mbs_len + 1);
    wcstombs(&tmp[0], src.c_str(), tmp.size());

    dest.assign(tmp.begin(), tmp.end() - 1);

    return dest;
}